

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O2

Node * __thiscall
anon_unknown.dwarf_38a::NinjaMain::CollectTarget(NinjaMain *this,char *cpath,string *err)

{
  pointer ppEVar1;
  Edge *this_00;
  pointer ppNVar2;
  bool bVar3;
  Node *pNVar4;
  StringPiece path_00;
  string path;
  uint64_t slash_bits;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  uint64_t local_48;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,cpath,(allocator<char> *)&local_68);
  bVar3 = CanonicalizePath(&local_a8,&local_48,err);
  if (bVar3) {
    if (local_a8._M_string_length == 0) {
      local_a8._M_string_length = 0;
LAB_001070fd:
      bVar3 = false;
    }
    else {
      if (local_a8._M_dataplus._M_p[local_a8._M_string_length - 1] != '^') goto LAB_001070fd;
      std::__cxx11::string::resize((ulong)&local_a8);
      bVar3 = true;
    }
    path_00.len_ = local_a8._M_string_length;
    path_00.str_ = local_a8._M_dataplus._M_p;
    pNVar4 = State::LookupNode(&this->state_,path_00);
    if (pNVar4 == (Node *)0x0) {
      Node::PathDecanonicalized(&local_40,&local_a8,local_48);
      std::operator+(&local_88,"unknown target \'",&local_40);
      std::operator+(&local_68,&local_88,"\'");
      std::__cxx11::string::operator=((string *)err,(string *)&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_40);
      bVar3 = std::operator==(&local_a8,"clean");
      if ((bVar3) || (bVar3 = std::operator==(&local_a8,"help"), bVar3)) {
        std::__cxx11::string::append((char *)err);
      }
      else {
        pNVar4 = State::SpellcheckNode(&this->state_,&local_a8);
        if (pNVar4 != (Node *)0x0) {
          std::operator+(&local_88,", did you mean \'",&pNVar4->path_);
          std::operator+(&local_68,&local_88,"\'?");
          std::__cxx11::string::append((string *)err);
          goto LAB_0010727c;
        }
      }
    }
    else {
      if (!bVar3) goto LAB_0010728e;
      ppEVar1 = (pNVar4->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (ppEVar1 !=
          (pNVar4->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        this_00 = *ppEVar1;
        ppNVar2 = (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (ppNVar2 ==
            (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          Edge::Dump(this_00,"");
          Fatal("edge has no outputs");
        }
        pNVar4 = *ppNVar2;
        goto LAB_0010728e;
      }
      std::operator+(&local_88,"\'",&local_a8);
      std::operator+(&local_68,&local_88,"\' has no out edge");
      std::__cxx11::string::operator=((string *)err,(string *)&local_68);
LAB_0010727c:
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_88);
    }
  }
  pNVar4 = (Node *)0x0;
LAB_0010728e:
  std::__cxx11::string::~string((string *)&local_a8);
  return pNVar4;
}

Assistant:

Node* NinjaMain::CollectTarget(const char* cpath, string* err) {
  string path = cpath;
  uint64_t slash_bits;
  if (!CanonicalizePath(&path, &slash_bits, err))
    return NULL;

  // Special syntax: "foo.cc^" means "the first output of foo.cc".
  bool first_dependent = false;
  if (!path.empty() && path[path.size() - 1] == '^') {
    path.resize(path.size() - 1);
    first_dependent = true;
  }

  Node* node = state_.LookupNode(path);
  if (node) {
    if (first_dependent) {
      if (node->out_edges().empty()) {
        *err = "'" + path + "' has no out edge";
        return NULL;
      }
      Edge* edge = node->out_edges()[0];
      if (edge->outputs_.empty()) {
        edge->Dump();
        Fatal("edge has no outputs");
      }
      node = edge->outputs_[0];
    }
    return node;
  } else {
    *err =
        "unknown target '" + Node::PathDecanonicalized(path, slash_bits) + "'";
    if (path == "clean") {
      *err += ", did you mean 'ninja -t clean'?";
    } else if (path == "help") {
      *err += ", did you mean 'ninja -h'?";
    } else {
      Node* suggestion = state_.SpellcheckNode(path);
      if (suggestion) {
        *err += ", did you mean '" + suggestion->path() + "'?";
      }
    }
    return NULL;
  }
}